

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O0

void Diligent::CopyPipelineResourceSignatureDesc
               (FixedLinearAllocator *Allocator,PipelineResourceSignatureDesc *SrcDesc,
               PipelineResourceSignatureDesc *DstDesc,array<unsigned_short,_4UL> *ResourceOffsets)

{
  value_type_conflict2 vVar1;
  char (*Args_1) [49];
  Uint32 UVar2;
  PipelineResourceDesc *pPVar3;
  ImmutableSamplerDesc *pIVar4;
  PipelineResourceDesc *pPVar5;
  Char *pCVar6;
  reference pvVar7;
  size_type sVar8;
  ImmutableSamplerDesc *__src;
  char (*Args_1_00) [81];
  undefined1 local_c0 [8];
  string msg_1;
  ImmutableSamplerDesc *DstSam;
  ImmutableSamplerDesc *SrcSam;
  ulong uStack_88;
  Uint32 i_2;
  size_t i_1;
  undefined1 local_70 [8];
  string msg;
  PipelineResourceDesc *DstRes;
  PipelineResourceDesc *SrcRes;
  Uint32 i;
  ImmutableSamplerDesc *pSamplers;
  PipelineResourceDesc *pResources;
  array<unsigned_short,_4UL> *ResourceOffsets_local;
  PipelineResourceSignatureDesc *DstDesc_local;
  PipelineResourceSignatureDesc *SrcDesc_local;
  FixedLinearAllocator *Allocator_local;
  
  pPVar3 = FixedLinearAllocator::ConstructArray<Diligent::PipelineResourceDesc>
                     (Allocator,(ulong)SrcDesc->NumResources);
  pIVar4 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                     (Allocator,(ulong)SrcDesc->NumImmutableSamplers);
  for (SrcRes._4_4_ = 0; SrcRes._4_4_ < SrcDesc->NumResources; SrcRes._4_4_ = SrcRes._4_4_ + 1) {
    pPVar5 = SrcDesc->Resources + SrcRes._4_4_;
    msg.field_2._8_8_ = pPVar3 + SrcRes._4_4_;
    ((PipelineResourceDesc *)msg.field_2._8_8_)->Name = pPVar5->Name;
    UVar2 = pPVar5->ArraySize;
    ((PipelineResourceDesc *)msg.field_2._8_8_)->ShaderStages = pPVar5->ShaderStages;
    ((PipelineResourceDesc *)msg.field_2._8_8_)->ArraySize = UVar2;
    Args_1 = *(char (**) [49])&pPVar5->ResourceType;
    *(char (**) [49])&((PipelineResourceDesc *)msg.field_2._8_8_)->ResourceType = Args_1;
    if ((pPVar5->Name == (Char *)0x0) || (*pPVar5->Name == '\0')) {
      FormatString<char[26],char[49]>
                ((string *)local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SrcRes.Name != nullptr && SrcRes.Name[0] != \'\\0\'",Args_1);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"CopyPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1db);
      std::__cxx11::string::~string((string *)local_70);
    }
    pCVar6 = FixedLinearAllocator::CopyString(Allocator,pPVar5->Name,0);
    *(Char **)msg.field_2._8_8_ = pCVar6;
    pvVar7 = std::array<unsigned_short,_4UL>::operator[]
                       (ResourceOffsets,(ulong)*(byte *)(msg.field_2._8_8_ + 0x11) + 1);
    *pvVar7 = *pvVar7 + 1;
  }
  std::
  stable_sort<Diligent::PipelineResourceDesc*,Diligent::CopyPipelineResourceSignatureDesc(Diligent::FixedLinearAllocator&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureDesc&,std::array<unsigned_short,4ul>&)::__0>
            (pPVar3,pPVar3 + SrcDesc->NumResources);
  uStack_88 = 1;
  while( true ) {
    sVar8 = std::array<unsigned_short,_4UL>::size(ResourceOffsets);
    if (sVar8 <= uStack_88) break;
    pvVar7 = std::array<unsigned_short,_4UL>::operator[](ResourceOffsets,uStack_88 - 1);
    vVar1 = *pvVar7;
    pvVar7 = std::array<unsigned_short,_4UL>::operator[](ResourceOffsets,uStack_88);
    *pvVar7 = *pvVar7 + vVar1;
    uStack_88 = uStack_88 + 1;
  }
  for (SrcSam._4_4_ = 0; SrcSam._4_4_ < SrcDesc->NumImmutableSamplers;
      SrcSam._4_4_ = SrcSam._4_4_ + 1) {
    __src = SrcDesc->ImmutableSamplers + SrcSam._4_4_;
    Args_1_00 = (char (*) [81])((ulong)SrcSam._4_4_ * 0x48);
    msg_1.field_2._8_8_ = pIVar4 + SrcSam._4_4_;
    memcpy((void *)msg_1.field_2._8_8_,__src,0x48);
    if ((__src->SamplerOrTextureName == (Char *)0x0) || (*__src->SamplerOrTextureName == '\0')) {
      FormatString<char[26],char[81]>
                ((string *)local_c0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "SrcSam.SamplerOrTextureName != nullptr && SrcSam.SamplerOrTextureName[0] != \'\\0\'"
                 ,Args_1_00);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"CopyPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1f6);
      std::__cxx11::string::~string((string *)local_c0);
    }
    pCVar6 = FixedLinearAllocator::CopyString(Allocator,__src->SamplerOrTextureName,0);
    *(Char **)(msg_1.field_2._8_8_ + 8) = pCVar6;
    pCVar6 = FixedLinearAllocator::CopyString
                       (Allocator,(__src->Desc).super_DeviceObjectAttribs.Name,0);
    *(Char **)(msg_1.field_2._8_8_ + 0x10) = pCVar6;
    if (*(long *)(msg_1.field_2._8_8_ + 0x10) == 0) {
      *(char **)(msg_1.field_2._8_8_ + 0x10) = "";
    }
  }
  DstDesc->Resources = pPVar3;
  DstDesc->ImmutableSamplers = pIVar4;
  if ((SrcDesc->UseCombinedTextureSamplers & 1U) != 0) {
    pCVar6 = FixedLinearAllocator::CopyString(Allocator,SrcDesc->CombinedSamplerSuffix,0);
    DstDesc->CombinedSamplerSuffix = pCVar6;
  }
  return;
}

Assistant:

void CopyPipelineResourceSignatureDesc(FixedLinearAllocator&                                            Allocator,
                                       const PipelineResourceSignatureDesc&                             SrcDesc,
                                       PipelineResourceSignatureDesc&                                   DstDesc,
                                       std::array<Uint16, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES + 1>& ResourceOffsets)
{
    PipelineResourceDesc* pResources = Allocator.ConstructArray<PipelineResourceDesc>(SrcDesc.NumResources);
    ImmutableSamplerDesc* pSamplers  = Allocator.ConstructArray<ImmutableSamplerDesc>(SrcDesc.NumImmutableSamplers);

    for (Uint32 i = 0; i < SrcDesc.NumResources; ++i)
    {
        const PipelineResourceDesc& SrcRes = SrcDesc.Resources[i];
        PipelineResourceDesc&       DstRes = pResources[i];

        DstRes = SrcRes;
        VERIFY_EXPR(SrcRes.Name != nullptr && SrcRes.Name[0] != '\0');
        DstRes.Name = Allocator.CopyString(SrcRes.Name);

        ++ResourceOffsets[size_t{DstRes.VarType} + 1];
    }

    // Sort resources by variable type (all static -> all mutable -> all dynamic).
    // NB: It is crucial to use stable sort to make sure that relative
    //     positions of resources are preserved.
    //     std::sort may reposition equal elements differently depending on
    //     the original arrangement, e.g.:
    //          B1 B2 A1 A2 -> A1 A2 B1 B2
    //          A1 B1 A2 B2 -> A2 A1 B2 B1
    std::stable_sort(pResources, pResources + SrcDesc.NumResources,
                     [](const PipelineResourceDesc& lhs, const PipelineResourceDesc& rhs) {
                         return lhs.VarType < rhs.VarType;
                     });

    for (size_t i = 1; i < ResourceOffsets.size(); ++i)
        ResourceOffsets[i] += ResourceOffsets[i - 1];

    for (Uint32 i = 0; i < SrcDesc.NumImmutableSamplers; ++i)
    {
        const ImmutableSamplerDesc& SrcSam = SrcDesc.ImmutableSamplers[i];
        ImmutableSamplerDesc&       DstSam = pSamplers[i];

        DstSam = SrcSam;
        VERIFY_EXPR(SrcSam.SamplerOrTextureName != nullptr && SrcSam.SamplerOrTextureName[0] != '\0');
        DstSam.SamplerOrTextureName = Allocator.CopyString(SrcSam.SamplerOrTextureName);
        DstSam.Desc.Name            = Allocator.CopyString(SrcSam.Desc.Name);
        if (!DstSam.Desc.Name)
            DstSam.Desc.Name = "";
    }

    DstDesc.Resources         = pResources;
    DstDesc.ImmutableSamplers = pSamplers;

    if (SrcDesc.UseCombinedTextureSamplers)
        DstDesc.CombinedSamplerSuffix = Allocator.CopyString(SrcDesc.CombinedSamplerSuffix);
}